

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O0

void client(int count)

{
  bool bVar1;
  element_type *this;
  ErrorCallback local_150;
  ConnectCallback local_130;
  Addr local_110;
  Addr local_98;
  undefined1 local_20 [24];
  int i;
  int count_local;
  
  local_20._20_4_ = count;
  for (local_20._16_4_ = 0; (int)local_20._16_4_ < (int)local_20._20_4_;
      local_20._16_4_ = local_20._16_4_ + 1) {
    hwnet::Addr::MakeIP4Addr(&local_98,ip,0x22b8);
    hwnet::Addr::Addr(&local_110);
    hwnet::TCPConnector::New((Poller *)local_20,(Addr *)&poller_,&local_98);
    this = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
    std::function<void(int)>::function<void(&)(int),void>
              ((function<void(int)> *)&local_130,onConnect);
    std::function<void(int,hwnet::Addr_const&)>::function<void(&)(int,hwnet::Addr_const&),void>
              ((function<void(int,hwnet::Addr_const&)> *)&local_150,connectError);
    bVar1 = hwnet::TCPConnector::Connect(this,&local_130,&local_150);
    std::function<void_(int,_const_hwnet::Addr_&)>::~function(&local_150);
    std::function<void_(int)>::~function(&local_130);
    std::shared_ptr<hwnet::TCPConnector>::~shared_ptr((shared_ptr<hwnet::TCPConnector> *)local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      printf("connect error\n");
    }
  }
  return;
}

Assistant:

void client(int count) {
	for(int i = 0; i < count; ++i) {
		if(!TCPConnector::New(&poller_,Addr::MakeIP4Addr(ip,port))->Connect(onConnect,connectError)){
			printf("connect error\n");
		}
	}
}